

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproperty_p.h
# Opt level: O3

void __thiscall QPropertyObserverPointer::unlink_common(QPropertyObserverPointer *this)

{
  ulong *puVar1;
  QPropertyObserver *pQVar2;
  ulong uVar3;
  
  pQVar2 = this->ptr;
  uVar3 = (pQVar2->super_QPropertyObserverBase).next.d;
  if (7 < uVar3) {
    *(quintptr **)((uVar3 & 0xfffffffffffffff8) + 8) = (pQVar2->super_QPropertyObserverBase).prev.d;
    pQVar2 = this->ptr;
    uVar3 = (pQVar2->super_QPropertyObserverBase).next.d;
  }
  puVar1 = (pQVar2->super_QPropertyObserverBase).prev.d;
  if (puVar1 != (ulong *)0x0) {
    *puVar1 = (ulong)((uint)*puVar1 & 7) | uVar3 & 0xfffffffffffffff8;
    uVar3 = (pQVar2->super_QPropertyObserverBase).next.d;
  }
  (pQVar2->super_QPropertyObserverBase).next.d = (ulong)((uint)uVar3 & 7);
  (pQVar2->super_QPropertyObserverBase).prev.d = (quintptr *)0x0;
  return;
}

Assistant:

void unlink_common()
    {
        if (ptr->next)
            ptr->next->prev = ptr->prev;
        if (ptr->prev)
            ptr->prev.setPointer(ptr->next.data());
        ptr->next = nullptr;
        ptr->prev.clear();
    }